

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

quaternion * quaternion_inverse(quaternion *self)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar1 = (self->field_0).q[0];
  fVar2 = (self->field_0).q[1];
  fVar3 = (self->field_0).q[2];
  fVar4 = (self->field_0).q[3];
  fVar5 = fVar4 * fVar4 + fVar3 * fVar3 + fVar1 * fVar1 + fVar2 * fVar2;
  if (1e-05 <= fVar5) {
    (self->field_0).q[0] = -fVar1;
    (self->field_0).q[1] = -fVar2;
    (self->field_0).q[2] = -fVar3;
    fVar7 = fVar5 + -1.0;
    fVar6 = -fVar7;
    if (-fVar7 <= fVar7) {
      fVar6 = fVar7;
    }
    if (1e-05 <= fVar6) {
      (self->field_0).q[0] = -fVar1 / fVar5;
      (self->field_0).q[1] = -fVar2 / fVar5;
      (self->field_0).q[2] = -fVar3 / fVar5;
      (self->field_0).q[3] = fVar4 / fVar5;
    }
  }
  return self;
}

Assistant:

HYPAPI struct quaternion *quaternion_inverse(struct quaternion *self)
{
	HYP_FLOAT norm;

	norm = quaternion_norm(self);

	if (scalar_equalsf(norm, 0.0f)) {
		/* avoid divide by zero */
		return self;
	}

	quaternion_conjugate(self);

	if (scalar_equalsf(norm, 1.0f)) {
		/* we're done */
		return self;
	}

	self->x /= norm;
	self->y /= norm;
	self->z /= norm;
	self->w /= norm;

	return self;
}